

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode parseurl(char *url,CURLU *u,uint flags)

{
  _Bool _Var1;
  int iVar2;
  CURLUcode CVar3;
  CURLcode CVar4;
  size_t sVar5;
  size_t sVar6;
  Curl_handler *pCVar7;
  char *pcVar8;
  char *pcVar9;
  ulong length;
  size_t sVar10;
  bool bVar11;
  char *hostname;
  char normalized_ipv4 [17];
  char *newp;
  dynbuf enc_1;
  dynbuf enc;
  size_t qlen;
  int i;
  size_t len;
  char *hostp;
  char *p;
  char *ptr;
  dynbuf host;
  size_t fraglen;
  CURLUcode result;
  size_t urllen;
  size_t schemelen;
  char *schemep;
  char schemebuf [41];
  char *fragment;
  char *query;
  size_t sStack_38;
  _Bool uncpath;
  size_t pathlen;
  char *path;
  uint flags_local;
  CURLU *u_local;
  char *url_local;
  
  schemelen = 0;
  fraglen._4_4_ = CURLUE_OK;
  host.toobig = 0;
  Curl_dyn_init((dynbuf *)&ptr,8000000);
  sVar5 = strlen(url);
  if (8000000 < sVar5) {
    fraglen._4_4_ = CURLUE_MALFORMED_INPUT;
    goto LAB_0013ce51;
  }
  sVar6 = Curl_is_absolute_url(url,(char *)&schemep,0x29,(flags & 0x204) != 0);
  if ((sVar6 == 0) || (iVar2 = strcmp((char *)&schemep,"file"), iVar2 != 0)) {
    if (sVar6 == 0) {
      if ((flags & 0x204) == 0) {
        fraglen._4_4_ = CURLUE_BAD_SCHEME;
        goto LAB_0013ce51;
      }
      hostp = url;
      if ((flags & 4) != 0) {
        schemelen = (size_t)anon_var_dwarf_46372;
      }
    }
    else {
      qlen._4_4_ = 0;
      hostp = url + sVar6 + 1;
      while( true ) {
        bVar11 = false;
        if ((hostp != (char *)0x0) && (bVar11 = false, *hostp == '/')) {
          bVar11 = qlen._4_4_ < 4;
        }
        if (!bVar11) break;
        hostp = hostp + 1;
        qlen._4_4_ = qlen._4_4_ + 1;
      }
      schemelen = (size_t)&schemep;
      pCVar7 = Curl_builtin_scheme((char *)schemelen,0xffffffffffffffff);
      if ((pCVar7 == (Curl_handler *)0x0) && ((flags & 8) == 0)) {
        fraglen._4_4_ = CURLUE_UNSUPPORTED_SCHEME;
        goto LAB_0013ce51;
      }
      if ((qlen._4_4_ < 1) || (3 < qlen._4_4_)) {
        fraglen._4_4_ = CURLUE_BAD_SLASHES;
        goto LAB_0013ce51;
      }
      _Var1 = junkscan((char *)schemelen,flags);
      url = hostp;
      if (_Var1) {
        fraglen._4_4_ = CURLUE_BAD_SCHEME;
        goto LAB_0013ce51;
      }
    }
    while( true ) {
      bVar11 = false;
      if (*hostp != '\0') {
        bVar11 = true;
        if ((*hostp != '/') && (bVar11 = true, *hostp != '?')) {
          bVar11 = *hostp == '#';
        }
        bVar11 = (bool)(bVar11 ^ 1);
      }
      if (!bVar11) break;
      hostp = hostp + 1;
    }
    if ((long)hostp - (long)url == 0) {
      if ((flags & 0x400) == 0) {
        fraglen._4_4_ = CURLUE_NO_HOST;
        goto LAB_0013ce51;
      }
    }
    else {
      CVar4 = Curl_dyn_addn((dynbuf *)&ptr,url,(long)hostp - (long)url);
      if (CVar4 != CURLE_OK) {
        fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
        goto LAB_0013ce51;
      }
    }
    pathlen = (size_t)hostp;
    if (schemelen != 0) {
      pcVar8 = (*Curl_cstrdup)((char *)schemelen);
      u->scheme = pcVar8;
      if (u->scheme == (char *)0x0) {
        fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
        goto LAB_0013ce51;
      }
    }
  }
  else {
    if (sVar5 < 7) {
      fraglen._4_4_ = CURLUE_BAD_FILE_URL;
      goto LAB_0013ce51;
    }
    pathlen = (size_t)(url + 5);
    schemelen = (size_t)(*Curl_cstrdup)("file");
    u->scheme = (char *)schemelen;
    if (u->scheme == (char *)0x0) {
      fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
      goto LAB_0013ce51;
    }
    if ((*(char *)pathlen == '/') && (url[6] == '/')) {
      p = url + 7;
      if ((*p != '/') &&
         ((((*p < 'a' || ('z' < *p)) && ((*p < 'A' || ('Z' < *p)))) ||
          (((url[8] != ':' && (url[8] != '|')) ||
           ((url[9] != '/' && ((url[9] != '\\' && (url[9] != '\0')))))))))) {
        iVar2 = curl_strnequal(p,"localhost/",10);
        if ((iVar2 == 0) && (iVar2 = curl_strnequal(p,"127.0.0.1/",10), iVar2 == 0)) {
          fraglen._4_4_ = CURLUE_BAD_FILE_URL;
          goto LAB_0013ce51;
        }
        p = url + 0x10;
      }
      pathlen = (size_t)p;
    }
    Curl_dyn_reset((dynbuf *)&ptr);
    if ((((*(char *)pathlen == '/') &&
         (((('`' < *(char *)(pathlen + 1) && (*(char *)(pathlen + 1) < '{')) ||
           (('@' < *(char *)(pathlen + 1) && (*(char *)(pathlen + 1) < '[')))) &&
          ((*(char *)(pathlen + 2) == ':' || (*(char *)(pathlen + 2) == '|')))))) &&
        ((*(char *)(pathlen + 3) == '/' ||
         ((*(char *)(pathlen + 3) == '\\' || (*(char *)(pathlen + 3) == '\0')))))) ||
       (((('`' < *(char *)pathlen && (*(char *)pathlen < '{')) ||
         (('@' < *(char *)pathlen && (*(char *)pathlen < '[')))) &&
        (((*(char *)(pathlen + 1) == ':' || (*(char *)(pathlen + 1) == '|')) &&
         (((*(char *)(pathlen + 2) == '/' || (*(char *)(pathlen + 2) == '\\')) ||
          (*(char *)(pathlen + 2) == '\0')))))))) {
      fraglen._4_4_ = CURLUE_BAD_FILE_URL;
      goto LAB_0013ce51;
    }
  }
  pcVar8 = strchr((char *)pathlen,0x23);
  if ((pcVar8 != (char *)0x0) && (host.toobig = strlen(pcVar8), 1 < host.toobig)) {
    pcVar9 = (char *)Curl_memdup(pcVar8 + 1,host.toobig);
    u->fragment = pcVar9;
    if (u->fragment == (char *)0x0) {
      fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
      goto LAB_0013ce51;
    }
    _Var1 = junkscan(u->fragment,flags);
    if (_Var1) {
      fraglen._4_4_ = CURLUE_BAD_FRAGMENT;
      goto LAB_0013ce51;
    }
  }
  pcVar9 = strchr((char *)pathlen,0x3f);
  if ((pcVar9 == (char *)0x0) || ((pcVar8 != (char *)0x0 && (pcVar8 <= pcVar9)))) {
    sVar5 = strlen((char *)pathlen);
    sStack_38 = sVar5 - host.toobig;
  }
  else {
    sVar5 = strlen(pcVar9);
    length = sVar5 - host.toobig;
    sVar5 = strlen((char *)pathlen);
    sStack_38 = (sVar5 - length) - host.toobig;
    if (length < 2) {
      pcVar8 = (*Curl_cstrdup)("");
      u->query = pcVar8;
      if (u->query == (char *)0x0) {
        fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
        goto LAB_0013ce51;
      }
    }
    else {
      if ((length == 0) || ((flags & 0x80) == 0)) {
        pcVar8 = (char *)Curl_memdup(pcVar9 + 1,length);
        u->query = pcVar8;
        if (u->query == (char *)0x0) {
          fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
          goto LAB_0013ce51;
        }
        u->query[length - 1] = '\0';
      }
      else {
        Curl_dyn_init((dynbuf *)&enc_1.toobig,8000000);
        CVar3 = urlencode_str((dynbuf *)&enc_1.toobig,pcVar9 + 1,length - 1,true,true);
        if (CVar3 != CURLUE_OK) {
          fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
          goto LAB_0013ce51;
        }
        pcVar8 = Curl_dyn_ptr((dynbuf *)&enc_1.toobig);
        u->query = pcVar8;
      }
      _Var1 = junkscan(u->query,flags);
      if (_Var1) {
        fraglen._4_4_ = CURLUE_BAD_QUERY;
        goto LAB_0013ce51;
      }
    }
  }
  if ((sStack_38 != 0) && ((flags & 0x80) != 0)) {
    Curl_dyn_init((dynbuf *)&newp,8000000);
    CVar3 = urlencode_str((dynbuf *)&newp,(char *)pathlen,sStack_38,true,false);
    if (CVar3 != CURLUE_OK) {
      fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
      goto LAB_0013ce51;
    }
    sStack_38 = Curl_dyn_len((dynbuf *)&newp);
    pathlen = (size_t)Curl_dyn_ptr((dynbuf *)&newp);
    u->path = (char *)pathlen;
  }
  if (sStack_38 != 0) {
    if (u->path == (char *)0x0) {
      pcVar8 = (char *)Curl_memdup((void *)pathlen,sStack_38 + 1);
      u->path = pcVar8;
      if (u->path == (char *)0x0) {
        fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
        goto LAB_0013ce51;
      }
      u->path[sStack_38] = '\0';
      pathlen = (size_t)u->path;
    }
    else if ((flags & 0x80) != 0) {
      u->path[sStack_38] = '\0';
    }
    _Var1 = junkscan(u->path,flags);
    if (_Var1) {
      fraglen._4_4_ = CURLUE_BAD_PATH;
      goto LAB_0013ce51;
    }
    if ((flags & 0x10) == 0) {
      pcVar8 = dedotdotify((char *)pathlen,sStack_38);
      if (pcVar8 == (char *)0x0) {
        fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
        goto LAB_0013ce51;
      }
      (*Curl_cfree)(u->path);
      u->path = pcVar8;
    }
  }
  sVar10 = Curl_dyn_len((dynbuf *)&ptr);
  if (sVar10 == 0) {
    if (((flags & 0x400) == 0) || (CVar4 = Curl_dyn_add((dynbuf *)&ptr,""), CVar4 == CURLE_OK))
    goto LAB_0013ce2f;
    fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
  }
  else {
    fraglen._4_4_ = parse_hostname_login(u,(dynbuf *)&ptr,flags);
    if (fraglen._4_4_ == CURLUE_OK) {
      fraglen._4_4_ = Curl_parse_port(u,(dynbuf *)&ptr,sVar6 != 0);
    }
    if (fraglen._4_4_ == CURLUE_OK) {
      pcVar8 = Curl_dyn_ptr((dynbuf *)&ptr);
      _Var1 = junkscan(pcVar8,flags);
      if (!_Var1) {
        pcVar8 = Curl_dyn_ptr((dynbuf *)&ptr);
        _Var1 = ipv4_normalize(pcVar8,(char *)&hostname,0x11);
        if (_Var1) {
          Curl_dyn_reset((dynbuf *)&ptr);
          CVar4 = Curl_dyn_add((dynbuf *)&ptr,(char *)&hostname);
          if (CVar4 != CURLE_OK) {
            fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
            goto LAB_0013ce51;
          }
        }
        else {
          fraglen._4_4_ = decode_host((dynbuf *)&ptr);
          if (fraglen._4_4_ == CURLUE_OK) {
            pcVar8 = Curl_dyn_ptr((dynbuf *)&ptr);
            sVar6 = Curl_dyn_len((dynbuf *)&ptr);
            fraglen._4_4_ = hostname_check(u,pcVar8,sVar6);
          }
          if (fraglen._4_4_ != CURLUE_OK) goto LAB_0013ce51;
        }
        if (((flags & 0x200) != 0) && (schemelen == 0)) {
          pcVar8 = Curl_dyn_ptr((dynbuf *)&ptr);
          iVar2 = curl_strnequal(pcVar8,"ftp.",4);
          if (iVar2 == 0) {
            iVar2 = curl_strnequal(pcVar8,"dict.",5);
            if (iVar2 == 0) {
              iVar2 = curl_strnequal(pcVar8,"ldap.",5);
              if (iVar2 == 0) {
                iVar2 = curl_strnequal(pcVar8,"imap.",5);
                if (iVar2 == 0) {
                  iVar2 = curl_strnequal(pcVar8,"smtp.",5);
                  if (iVar2 == 0) {
                    iVar2 = curl_strnequal(pcVar8,"pop3.",5);
                    if (iVar2 == 0) {
                      schemelen = (size_t)anon_var_dwarf_463b4;
                    }
                    else {
                      schemelen = (size_t)anon_var_dwarf_47ebd;
                    }
                  }
                  else {
                    schemelen = (size_t)anon_var_dwarf_47ea7;
                  }
                }
                else {
                  schemelen = (size_t)anon_var_dwarf_47e91;
                }
              }
              else {
                schemelen = (size_t)anon_var_dwarf_47e7b;
              }
            }
            else {
              schemelen = (size_t)anon_var_dwarf_47e65;
            }
          }
          else {
            schemelen = (size_t)anon_var_dwarf_47e4f;
          }
          pcVar8 = (*Curl_cstrdup)((char *)schemelen);
          u->scheme = pcVar8;
          if (u->scheme == (char *)0x0) {
            fraglen._4_4_ = CURLUE_OUT_OF_MEMORY;
            goto LAB_0013ce51;
          }
        }
LAB_0013ce2f:
        pcVar8 = Curl_dyn_ptr((dynbuf *)&ptr);
        u->host = pcVar8;
        return fraglen._4_4_;
      }
      fraglen._4_4_ = CURLUE_BAD_HOSTNAME;
    }
  }
LAB_0013ce51:
  Curl_dyn_free((dynbuf *)&ptr);
  free_urlhandle(u);
  return fraglen._4_4_;
}

Assistant:

static CURLUcode parseurl(const char *url, CURLU *u, unsigned int flags)
{
  const char *path;
  size_t pathlen;
  bool uncpath = FALSE;
  char *query = NULL;
  char *fragment = NULL;
  char schemebuf[MAX_SCHEME_LEN + 1];
  const char *schemep = NULL;
  size_t schemelen = 0;
  size_t urllen;
  CURLUcode result = CURLUE_OK;
  size_t fraglen = 0;
  struct dynbuf host;

  DEBUGASSERT(url);

  Curl_dyn_init(&host, CURL_MAX_INPUT_LENGTH);

  /*************************************************************
   * Parse the URL.
   ************************************************************/
  /* allocate scratch area */
  urllen = strlen(url);
  if(urllen > CURL_MAX_INPUT_LENGTH) {
    /* excessive input length */
    result = CURLUE_MALFORMED_INPUT;
    goto fail;
  }

  schemelen = Curl_is_absolute_url(url, schemebuf, sizeof(schemebuf),
                                   flags & (CURLU_GUESS_SCHEME|
                                            CURLU_DEFAULT_SCHEME));

  /* handle the file: scheme */
  if(schemelen && !strcmp(schemebuf, "file")) {
    if(urllen <= 6) {
      /* file:/ is not enough to actually be a complete file: URL */
      result = CURLUE_BAD_FILE_URL;
      goto fail;
    }

    /* path has been allocated large enough to hold this */
    path = (char *)&url[5];

    schemep = u->scheme = strdup("file");
    if(!u->scheme) {
      result = CURLUE_OUT_OF_MEMORY;
      goto fail;
    }

    /* Extra handling URLs with an authority component (i.e. that start with
     * "file://")
     *
     * We allow omitted hostname (e.g. file:/<path>) -- valid according to
     * RFC 8089, but not the (current) WHAT-WG URL spec.
     */
    if(path[0] == '/' && path[1] == '/') {
      /* swallow the two slashes */
      const char *ptr = &path[2];

      /*
       * According to RFC 8089, a file: URL can be reliably dereferenced if:
       *
       *  o it has no/blank hostname, or
       *
       *  o the hostname matches "localhost" (case-insensitively), or
       *
       *  o the hostname is a FQDN that resolves to this machine, or
       *
       *  o it is an UNC String transformed to an URI (Windows only, RFC 8089
       *    Appendix E.3).
       *
       * For brevity, we only consider URLs with empty, "localhost", or
       * "127.0.0.1" hostnames as local, otherwise as an UNC String.
       *
       * Additionally, there is an exception for URLs with a Windows drive
       * letter in the authority (which was accidentally omitted from RFC 8089
       * Appendix E, but believe me, it was meant to be there. --MK)
       */
      if(ptr[0] != '/' && !STARTS_WITH_URL_DRIVE_PREFIX(ptr)) {
        /* the URL includes a host name, it must match "localhost" or
           "127.0.0.1" to be valid */
        if(checkprefix("localhost/", ptr) ||
           checkprefix("127.0.0.1/", ptr)) {
          ptr += 9; /* now points to the slash after the host */
        }
        else {
#if defined(WIN32)
          size_t len;

          /* the host name, NetBIOS computer name, can not contain disallowed
             chars, and the delimiting slash character must be appended to the
             host name */
          path = strpbrk(ptr, "/\\:*?\"<>|");
          if(!path || *path != '/') {
            result = CURLUE_BAD_FILE_URL;
            goto fail;
          }

          len = path - ptr;
          if(len) {
            if(Curl_dyn_addn(&host, ptr, len)) {
              result = CURLUE_OUT_OF_MEMORY;
              goto fail;
            }
            uncpath = TRUE;
          }

          ptr -= 2; /* now points to the // before the host in UNC */
#else
          /* Invalid file://hostname/, expected localhost or 127.0.0.1 or
             none */
          result = CURLUE_BAD_FILE_URL;
          goto fail;
#endif
        }
      }

      path = ptr;
    }

    if(!uncpath)
      /* no host for file: URLs by default */
      Curl_dyn_reset(&host);

#if !defined(MSDOS) && !defined(WIN32) && !defined(__CYGWIN__)
    /* Don't allow Windows drive letters when not in Windows.
     * This catches both "file:/c:" and "file:c:" */
    if(('/' == path[0] && STARTS_WITH_URL_DRIVE_PREFIX(&path[1])) ||
       STARTS_WITH_URL_DRIVE_PREFIX(path)) {
      /* File drive letters are only accepted in MSDOS/Windows */
      result = CURLUE_BAD_FILE_URL;
      goto fail;
    }
#else
    /* If the path starts with a slash and a drive letter, ditch the slash */
    if('/' == path[0] && STARTS_WITH_URL_DRIVE_PREFIX(&path[1])) {
      /* This cannot be done with strcpy, as the memory chunks overlap! */
      path++;
    }
#endif

  }
  else {
    /* clear path */
    const char *p;
    const char *hostp;
    size_t len;

    if(schemelen) {
      int i = 0;
      p = &url[schemelen + 1];
      while(p && (*p == '/') && (i < 4)) {
        p++;
        i++;
      }

      schemep = schemebuf;
      if(!Curl_builtin_scheme(schemep, CURL_ZERO_TERMINATED) &&
         !(flags & CURLU_NON_SUPPORT_SCHEME)) {
        result = CURLUE_UNSUPPORTED_SCHEME;
        goto fail;
      }

      if((i < 1) || (i>3)) {
        /* less than one or more than three slashes */
        result = CURLUE_BAD_SLASHES;
        goto fail;
      }
      if(junkscan(schemep, flags)) {
        result = CURLUE_BAD_SCHEME;
        goto fail;
      }
    }
    else {
      /* no scheme! */

      if(!(flags & (CURLU_DEFAULT_SCHEME|CURLU_GUESS_SCHEME))) {
        result = CURLUE_BAD_SCHEME;
        goto fail;
      }
      if(flags & CURLU_DEFAULT_SCHEME)
        schemep = DEFAULT_SCHEME;

      /*
       * The URL was badly formatted, let's try without scheme specified.
       */
      p = url;
    }
    hostp = p; /* host name starts here */

    /* find the end of the host name + port number */
    while(*p && !HOSTNAME_END(*p))
      p++;

    len = p - hostp;
    if(len) {
      if(Curl_dyn_addn(&host, hostp, len)) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }
    }
    else {
      if(!(flags & CURLU_NO_AUTHORITY)) {
        result = CURLUE_NO_HOST;
        goto fail;
      }
    }

    path = (char *)p;

    if(schemep) {
      u->scheme = strdup(schemep);
      if(!u->scheme) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }
    }
  }

  fragment = strchr(path, '#');
  if(fragment) {
    fraglen = strlen(fragment);
    if(fraglen > 1) {
      /* skip the leading '#' in the copy but include the terminating null */
      u->fragment = Curl_memdup(fragment + 1, fraglen);
      if(!u->fragment) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }

      if(junkscan(u->fragment, flags)) {
        result = CURLUE_BAD_FRAGMENT;
        goto fail;
      }
    }
  }

  query = strchr(path, '?');
  if(query && (!fragment || (query < fragment))) {
    size_t qlen = strlen(query) - fraglen; /* includes '?' */
    pathlen = strlen(path) - qlen - fraglen;
    if(qlen > 1) {
      if(qlen && (flags & CURLU_URLENCODE)) {
        struct dynbuf enc;
        Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
        /* skip the leading question mark */
        if(urlencode_str(&enc, query + 1, qlen - 1, TRUE, TRUE)) {
          result = CURLUE_OUT_OF_MEMORY;
          goto fail;
        }
        u->query = Curl_dyn_ptr(&enc);
      }
      else {
        u->query = Curl_memdup(query + 1, qlen);
        if(!u->query) {
          result = CURLUE_OUT_OF_MEMORY;
          goto fail;
        }
        u->query[qlen - 1] = 0;
      }

      if(junkscan(u->query, flags)) {
        result = CURLUE_BAD_QUERY;
        goto fail;
      }
    }
    else {
      /* single byte query */
      u->query = strdup("");
      if(!u->query) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }
    }
  }
  else
    pathlen = strlen(path) - fraglen;

  if(pathlen && (flags & CURLU_URLENCODE)) {
    struct dynbuf enc;
    Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);
    if(urlencode_str(&enc, path, pathlen, TRUE, FALSE)) {
      result = CURLUE_OUT_OF_MEMORY;
      goto fail;
    }
    pathlen = Curl_dyn_len(&enc);
    path = u->path = Curl_dyn_ptr(&enc);
  }

  if(!pathlen) {
    /* there is no path left, unset */
    path = NULL;
  }
  else {
    if(!u->path) {
      u->path = Curl_memdup(path, pathlen + 1);
      if(!u->path) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }
      u->path[pathlen] = 0;
      path = u->path;
    }
    else if(flags & CURLU_URLENCODE)
      /* it might have encoded more than just the path so cut it */
      u->path[pathlen] = 0;

    if(junkscan(u->path, flags)) {
      result = CURLUE_BAD_PATH;
      goto fail;
    }

    if(!(flags & CURLU_PATH_AS_IS)) {
      /* remove ../ and ./ sequences according to RFC3986 */
      char *newp = dedotdotify((char *)path, pathlen);
      if(!newp) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }
      free(u->path);
      u->path = newp;
    }
  }

  if(Curl_dyn_len(&host)) {
    char normalized_ipv4[sizeof("255.255.255.255") + 1];

    /*
     * Parse the login details and strip them out of the host name.
     */
    result = parse_hostname_login(u, &host, flags);
    if(!result)
      result = Curl_parse_port(u, &host, schemelen);
    if(result)
      goto fail;

    if(junkscan(Curl_dyn_ptr(&host), flags)) {
      result = CURLUE_BAD_HOSTNAME;
      goto fail;
    }

    if(ipv4_normalize(Curl_dyn_ptr(&host),
                      normalized_ipv4, sizeof(normalized_ipv4))) {
      Curl_dyn_reset(&host);
      if(Curl_dyn_add(&host, normalized_ipv4)) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }
    }
    else {
      result = decode_host(&host);
      if(!result)
        result = hostname_check(u, Curl_dyn_ptr(&host), Curl_dyn_len(&host));
      if(result)
        goto fail;
    }

    if((flags & CURLU_GUESS_SCHEME) && !schemep) {
      const char *hostname = Curl_dyn_ptr(&host);
      /* legacy curl-style guess based on host name */
      if(checkprefix("ftp.", hostname))
        schemep = "ftp";
      else if(checkprefix("dict.", hostname))
        schemep = "dict";
      else if(checkprefix("ldap.", hostname))
        schemep = "ldap";
      else if(checkprefix("imap.", hostname))
        schemep = "imap";
      else if(checkprefix("smtp.", hostname))
        schemep = "smtp";
      else if(checkprefix("pop3.", hostname))
        schemep = "pop3";
      else
        schemep = "http";

      u->scheme = strdup(schemep);
      if(!u->scheme) {
        result = CURLUE_OUT_OF_MEMORY;
        goto fail;
      }
    }
  }
  else if(flags & CURLU_NO_AUTHORITY) {
    /* allowed to be empty. */
    if(Curl_dyn_add(&host, "")) {
      result = CURLUE_OUT_OF_MEMORY;
      goto fail;
    }
  }

  u->host = Curl_dyn_ptr(&host);

  return result;
  fail:
  Curl_dyn_free(&host);
  free_urlhandle(u);
  return result;
}